

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_types.h
# Opt level: O2

Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
 __thiscall
viras::
quot<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>
          (viras *this,
          Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
          t,Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
            *p)

{
  Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  x;
  Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
  TVar1;
  WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
  WVar2;
  WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
  local_40;
  
  TVar1.
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
  .inner._content =
       (uint64_t)
       t.
       super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
       .config;
  WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
  ::WithConfig(&local_40,
               (WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::RealConstantType>
                *)t.
                  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
                  .inner._content._content);
  TVar1.
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
  .config = (Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>
             *)this;
  TVar1 = sugar::operator/(TVar1,(Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
                                  *)&local_40);
  x.
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
  .inner = TVar1.
           super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
           .inner._content;
  x.
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
  .config = (Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>
             *)x.
               super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
               .inner._content;
  WVar2 = (WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
           )floor<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>>,viras::DefaultOpts>>
                      ((viras *)TVar1.
                                super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>,_Kernel::TermList>
                                .config,x);
  Kernel::RationalConstantType::~RationalConstantType(&local_40.inner.super_RationalConstantType);
  return (Term<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
          )WVar2;
}

Assistant:

Term<C> quot(Term<C> t, Numeral<C> p) { return floor(t / p); }